

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

socket_t __thiscall httplib::Client::create_client_socket(Client *this)

{
  socket_t sVar1;
  string *psVar2;
  int *piVar3;
  bool bVar4;
  
  bVar4 = (this->proxy_host_)._M_string_length != 0;
  psVar2 = &this->host_;
  if (bVar4) {
    psVar2 = &this->proxy_host_;
  }
  piVar3 = &this->port_;
  if (bVar4) {
    piVar3 = &this->proxy_port_;
  }
  sVar1 = detail::create_client_socket
                    ((psVar2->_M_dataplus)._M_p,*piVar3,this->timeout_sec_,&this->interface_);
  return sVar1;
}

Assistant:

inline socket_t Client::create_client_socket() const {
  if (!proxy_host_.empty()) {
    return detail::create_client_socket(proxy_host_.c_str(), proxy_port_,
                                        timeout_sec_, interface_);
  }
  return detail::create_client_socket(host_.c_str(), port_, timeout_sec_,
                                      interface_);
}